

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,wchar_t **it)

{
  wchar_t *pwVar1;
  uint uVar2;
  int iVar3;
  wchar_t wVar4;
  ulong uVar5;
  ulong uVar6;
  wchar_t *pwVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  
  uVar2 = *(uint *)this;
  uVar5 = (ulong)uVar2;
  pwVar1 = *it + *(uint *)(this + 4);
  pwVar7 = pwVar1;
  if (uVar5 < 100) {
    if (uVar2 < 10) goto LAB_0012f383;
    uVar12 = uVar5 * 2;
    pwVar7 = pwVar1 + -1;
    pwVar1[-1] = (int)(char)internal::basic_data<void>::DIGITS[uVar5 * 2 + 1];
  }
  else {
    iVar10 = -1;
    uVar12 = 1;
    iVar13 = -2;
    uVar8 = 2;
    do {
      uVar6 = uVar5;
      uVar9 = (uint)uVar6;
      uVar2 = (uint)(uVar6 / 100);
      iVar3 = (int)(uVar6 / 100);
      uVar5 = (ulong)((uVar9 + iVar3 * -100) * 2);
      pwVar7[-1] = (int)(char)internal::basic_data<void>::DIGITS[uVar5 + 1];
      lVar14 = -4;
      if ((int)(uVar12 / 3) * 3 + iVar10 == 0) {
        pwVar7[-2] = *(wchar_t *)(this + 8);
        lVar14 = -8;
      }
      *(int *)((long)pwVar7 + lVar14 + -4) = (int)(char)internal::basic_data<void>::DIGITS[uVar5];
      if ((uVar8 / 3) * 3 + iVar13 == 0) {
        *(undefined4 *)((long)pwVar7 + lVar14 + -8) = *(undefined4 *)(this + 8);
        lVar14 = lVar14 + -8;
      }
      else {
        lVar14 = lVar14 + -4;
      }
      pwVar7 = (wchar_t *)((long)pwVar7 + lVar14);
      iVar10 = iVar10 + -2;
      uVar11 = (int)uVar12 + 2;
      uVar12 = (ulong)uVar11;
      iVar13 = iVar13 + -2;
      uVar8 = uVar8 + 2;
      uVar5 = uVar6 / 100;
    } while (9999 < uVar9);
    if (uVar9 < 1000) {
LAB_0012f383:
      wVar4 = uVar2 | 0x30;
      goto LAB_0012f3b7;
    }
    uVar12 = (ulong)(uint)(iVar3 + (int)(uVar6 / 100));
    pwVar7[-1] = (int)(char)internal::basic_data<void>::DIGITS[uVar12 + 1];
    if (iVar10 + (uVar11 / 3) * 3 == 0) {
      pwVar7[-2] = *(wchar_t *)(this + 8);
      pwVar7 = pwVar7 + -2;
    }
    else {
      pwVar7 = pwVar7 + -1;
    }
  }
  wVar4 = (wchar_t)(char)internal::basic_data<void>::DIGITS[uVar12 & 0xffffffff];
LAB_0012f3b7:
  pwVar7[-1] = wVar4;
  *it = pwVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = format_decimal(it, abs_value, size,
                            internal::add_thousands_sep<char_type>(s));
      }